

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.c
# Opt level: O2

void BrotliCompressFragmentTwoPassImpl16
               (MemoryManager *m,uint8_t *input,size_t input_size,int is_last,uint32_t *command_buf,
               uint8_t *literal_buf,int *table,size_t *storage_ix,uint8_t *storage)

{
  long *plVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint8_t *puVar7;
  byte bVar8;
  uint uVar9;
  undefined4 in_register_0000000c;
  uint32_t *commands;
  long *input_00;
  long *plVar10;
  long *plVar11;
  ulong uVar12;
  int *piVar13;
  long lVar14;
  ulong uVar15;
  long *__src;
  char *pcVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  uint8_t *puVar22;
  ulong uVar23;
  int iVar24;
  size_t input_size_00;
  bool bVar25;
  long lStackY_a0;
  uint32_t *local_90;
  uint *local_80;
  
  commands = (uint32_t *)CONCAT44(in_register_0000000c,is_last);
  input_00 = (long *)input;
  while( true ) {
    if (input_size == 0) {
      return;
    }
    input_size_00 = 0x20000;
    if (input_size < 0x20000) {
      input_size_00 = input_size;
    }
    plVar1 = (long *)((long)input_00 + input_size_00);
    local_90 = command_buf;
    __src = input_00;
    local_80 = commands;
    if (0xf < input_size) break;
LAB_00134c73:
    if (__src < plVar1) {
      uVar9 = (uint)((long)plVar1 - (long)__src);
      if (5 < uVar9) {
        if (uVar9 < 0x82) {
          uVar9 = uVar9 - 2;
          uVar3 = 0x1f;
          if (uVar9 != 0) {
            for (; uVar9 >> uVar3 == 0; uVar3 = uVar3 - 1) {
            }
          }
          bVar8 = (char)(uVar3 ^ 0xffffffe0) + 0x1f;
          uVar4 = uVar9 >> (bVar8 & 0x1f);
          uVar9 = (uVar9 - (uVar4 << (bVar8 & 0x1f))) * 0x100 |
                  uVar4 + (uVar3 ^ 0xffffffe0) * 2 + 0x40;
        }
        else if (uVar9 < 0x842) {
          uVar3 = 0x1f;
          if (uVar9 - 0x42 != 0) {
            for (; uVar9 - 0x42 >> uVar3 == 0; uVar3 = uVar3 - 1) {
            }
          }
          uVar9 = (((-1 << ((byte)uVar3 & 0x1f)) + uVar9 + -0x42) * 0x100 - (uVar3 ^ 0x1f)) + 0x29;
        }
        else {
          iVar6 = uVar9 * 0x100;
          if (uVar9 < 0x1842) {
            uVar9 = iVar6 - 0x841eb;
          }
          else if (uVar9 < 0x5842) {
            uVar9 = iVar6 - 0x1841ea;
          }
          else {
            uVar9 = iVar6 - 0x5841e9;
          }
        }
      }
      *local_80 = uVar9;
      local_80 = local_80 + 1;
      uVar23 = (long)plVar1 - (long)__src & 0xffffffff;
      memcpy(local_90,__src,uVar23);
      local_90 = (uint32_t *)((long)local_90 + uVar23);
    }
    iVar6 = ShouldCompress((uint8_t *)input_00,input_size_00,(long)local_90 - (long)command_buf);
    if (iVar6 == 0) {
      EmitUncompressedMetaBlock
                ((uint8_t *)input_00,input_size_00,(size_t *)table,(uint8_t *)storage_ix);
    }
    else {
      BrotliStoreMetaBlockHeader(input_size_00,0,(size_t *)table,(uint8_t *)storage_ix);
      uVar23 = *(ulong *)table;
      uVar15 = uVar23 >> 3;
      *(ulong *)((long)storage_ix + uVar15) = (ulong)*(byte *)((long)storage_ix + uVar15);
      *(ulong *)table = uVar23 + 0xd;
      StoreCommands(m,(uint8_t *)command_buf,(long)local_90 - (long)command_buf,commands,
                    (long)local_80 - (long)commands >> 2,(size_t *)table,(uint8_t *)storage_ix);
    }
    input_size = input_size - input_size_00;
    input_00 = plVar1;
  }
  uVar23 = input_size - 0x10;
  if (input_size_00 - 6 < input_size - 0x10) {
    uVar23 = input_size_00 - 6;
  }
  uVar15 = 0xffffffffffffffff;
LAB_0013471f:
  lVar14 = *(long *)((long)__src + 1);
  iVar6 = (int)uVar15;
  uVar12 = 0x20;
  plVar10 = (long *)((long)__src + 1);
  do {
    plVar11 = (long *)((uVar12 >> 5) + (long)plVar10);
    if ((long *)(uVar23 + (long)input_00) < plVar11) goto LAB_00134c73;
    uVar18 = (ulong)(lVar14 * 0x1e35a7bd0000) >> 0x30;
    lVar14 = *plVar11;
    iVar24 = (int)input;
    iVar5 = (int)plVar10;
    if (((((int)*plVar10 == *(int *)((long)plVar10 + -(long)iVar6)) &&
         (puVar7 = (uint8_t *)(-(long)iVar6 + (long)plVar10),
         *(uint8_t *)((long)plVar10 + 4) == puVar7[4])) &&
        (*(uint8_t *)((long)plVar10 + 5) == puVar7[5])) && (0 < iVar6)) {
      *(int *)(literal_buf + uVar18 * 4) = iVar5 - iVar24;
LAB_00134784:
      uVar18 = (long)plVar10 - (long)puVar7;
      if ((long)uVar18 < 0x3fff1) break;
    }
    else {
      iVar2 = *(int *)(literal_buf + uVar18 * 4);
      *(int *)(literal_buf + uVar18 * 4) = iVar5 - iVar24;
      if ((((int)*plVar10 == *(int *)(input + iVar2)) &&
          (puVar7 = input + iVar2, *(uint8_t *)((long)plVar10 + 4) == puVar7[4])) &&
         (*(uint8_t *)((long)plVar10 + 5) == puVar7[5])) goto LAB_00134784;
    }
    uVar12 = (ulong)((int)uVar12 + 1);
    plVar10 = plVar11;
  } while( true );
  uVar20 = (long)plVar1 + (-6 - (long)plVar10);
  uVar12 = uVar20 & 0xfffffffffffffff8;
  uVar19 = 0;
  lVar14 = 0;
LAB_001347ec:
  if (uVar20 >> 3 == uVar19) {
    uVar21 = (ulong)((uint)uVar20 & 7);
    puVar22 = (uint8_t *)((long)plVar10 + (6 - lVar14));
    for (; (bVar25 = uVar21 != 0, uVar21 = uVar21 - 1, uVar19 = uVar20, bVar25 &&
           (uVar19 = uVar12, puVar7[uVar12 + 6] == *puVar22)); uVar12 = uVar12 + 1) {
      puVar22 = puVar22 + 1;
    }
  }
  else {
    uVar21 = *(ulong *)((long)plVar10 + uVar19 * 8 + 6);
    if (uVar21 == *(ulong *)(puVar7 + uVar19 * 8 + 6)) goto code_r0x00134811;
    uVar21 = *(ulong *)(puVar7 + uVar19 * 8 + 6) ^ uVar21;
    uVar12 = 0;
    if (uVar21 != 0) {
      for (; (uVar21 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
      }
    }
    uVar19 = (uVar12 >> 3 & 0x1fffffff) - lVar14;
  }
  uVar3 = iVar5 - (int)__src;
  uVar9 = uVar3;
  if (5 < uVar3) {
    if (uVar3 < 0x82) {
      uVar4 = uVar3 - 2;
      uVar9 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      bVar8 = (char)(uVar9 ^ 0xffffffe0) + 0x1f;
      uVar17 = uVar4 >> (bVar8 & 0x1f);
      uVar9 = (uVar4 - (uVar17 << (bVar8 & 0x1f))) * 0x100 |
              uVar17 + (uVar9 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar3 < 0x842) {
      uVar9 = 0x1f;
      if (uVar3 - 0x42 != 0) {
        for (; uVar3 - 0x42 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      uVar9 = (((-1 << ((byte)uVar9 & 0x1f)) + uVar3 + -0x42) * 0x100 - (uVar9 ^ 0x1f)) + 0x29;
    }
    else {
      iVar5 = uVar3 * 0x100;
      if (uVar3 < 0x1842) {
        uVar9 = iVar5 - 0x841eb;
      }
      else if (uVar3 < 0x5842) {
        uVar9 = iVar5 - 0x1841ea;
      }
      else {
        uVar9 = iVar5 - 0x5841e9;
      }
    }
  }
  *local_80 = uVar9;
  memcpy(local_90,__src,(long)(int)uVar3);
  uVar9 = 0x40;
  if (iVar6 != (int)uVar18) {
    uVar4 = (int)uVar18 + 3;
    uVar9 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    bVar8 = 0x1e - (char)(uVar9 ^ 0x1f);
    bVar25 = (uVar4 >> (bVar8 & 0x1f) & 1) != 0;
    uVar9 = (uint)bVar25 +
            ((uVar4 - (bVar25 + 2 << (bVar8 & 0x1f))) * 0x100 | (uVar9 ^ 0x1f) * 2 ^ 0x3e) + 0x4c;
    uVar15 = uVar18 & 0xffffffff;
  }
  uVar12 = uVar19 + 6;
  local_80[1] = uVar9;
  if (uVar12 < 0xc) {
    uVar9 = (int)uVar12 + 0x14;
  }
  else {
    if (0x47 < uVar12) {
      if (uVar12 < 0x88) {
        uVar9 = ((uint)(uVar19 - 2) & 0x1f) << 8 | (int)(uVar19 - 2 >> 5) + 0x36U;
LAB_001349c6:
        local_80[2] = uVar9;
      }
      else {
        if (0x847 < uVar12) {
          uVar9 = (int)uVar12 * 0x100 - 0x847c1;
          goto LAB_001349c6;
        }
        uVar9 = (int)uVar19 - 0x42;
        iVar6 = 0x1f;
        if (uVar9 != 0) {
          for (; uVar9 >> iVar6 == 0; iVar6 = iVar6 + -1) {
          }
        }
        local_80[2] = ((int)(-1L << ((byte)iVar6 & 0x3f)) + (int)uVar19 + -0x42) * 0x100 + iVar6 +
                      0x34;
      }
      local_80[3] = 0x40;
      lStackY_a0 = 0x10;
      goto LAB_001349d4;
    }
    uVar9 = 0x1f;
    uVar4 = (uint)(uVar19 - 2);
    if (uVar4 != 0) {
      for (; uVar4 >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    bVar8 = (char)(uVar9 ^ 0xffffffe0) + 0x1f;
    iVar6 = (int)(uVar19 - 2 >> (bVar8 & 0x3f));
    uVar9 = (uVar4 - (iVar6 << (bVar8 & 0x1f))) * 0x100 | iVar6 + (uVar9 ^ 0xffffffe0) * 2 + 0x5a;
  }
  local_80[2] = uVar9;
  lStackY_a0 = 0xc;
LAB_001349d4:
  __src = (long *)((long)plVar10 + uVar19 + 6);
  local_90 = (uint32_t *)((long)local_90 + (long)(int)uVar3);
  local_80 = (uint *)((long)local_80 + lStackY_a0);
  while( true ) {
    if ((long *)(uVar23 + (long)input_00) <= __src) goto LAB_00134c73;
    uVar12 = *(ulong *)((long)__src + -5);
    iVar5 = (int)__src - iVar24;
    *(int *)(literal_buf + (uVar12 * 0x1e35a7bd0000 >> 0x30) * 4) = iVar5 + -5;
    *(int *)(literal_buf + ((uVar12 & 0xffffffffffff00) * 0x1e35a7bd00 >> 0x30) * 4) = iVar5 + -4;
    *(int *)(literal_buf + ((uVar12 & 0xffffffffffff0000) * 0x1e35a7bd >> 0x30) * 4) = iVar5 + -3;
    uVar12 = *(ulong *)((long)__src + -2);
    uVar18 = (uVar12 & 0xffffffffffff0000) * 0x1e35a7bd >> 0x30;
    *(int *)(literal_buf + (uVar12 * 0x1e35a7bd0000 >> 0x30) * 4) = iVar5 + -2;
    *(int *)(literal_buf + ((uVar12 & 0xffffffffffff00) * 0x1e35a7bd00 >> 0x30) * 4) = iVar5 + -1;
    iVar6 = *(int *)(literal_buf + uVar18 * 4);
    *(int *)(literal_buf + uVar18 * 4) = iVar5;
    piVar13 = (int *)(input + iVar6);
    uVar12 = (long)__src - (long)piVar13;
    if ((((0x3fff0 < (long)uVar12) || ((int)*__src != *piVar13)) ||
        (*(char *)((long)__src + 4) != (char)piVar13[1])) ||
       (*(char *)((long)__src + 5) != *(char *)((long)piVar13 + 5))) break;
    uVar15 = (long)plVar1 + (-6 - (long)__src);
    uVar18 = uVar15 & 0xfffffffffffffff8;
    uVar19 = 0;
    lVar14 = 0;
LAB_00134af2:
    if (uVar15 >> 3 == uVar19) {
      uVar20 = (ulong)((uint)uVar15 & 7);
      pcVar16 = (char *)((long)__src + (6 - lVar14));
      for (; (bVar25 = uVar20 != 0, uVar20 = uVar20 - 1, uVar19 = uVar15, bVar25 &&
             (uVar19 = uVar18, *(char *)((long)piVar13 + uVar18 + 6) == *pcVar16));
          uVar18 = uVar18 + 1) {
        pcVar16 = pcVar16 + 1;
      }
    }
    else {
      uVar20 = *(ulong *)((long)__src + uVar19 * 8 + 6);
      uVar21 = *(ulong *)((long)piVar13 + uVar19 * 8 + 6);
      if (uVar20 == uVar21) goto code_r0x00134b08;
      uVar21 = uVar21 ^ uVar20;
      uVar15 = 0;
      if (uVar21 != 0) {
        for (; (uVar21 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
        }
      }
      uVar19 = (uVar15 >> 3 & 0x1fffffff) - lVar14;
    }
    uVar15 = uVar19 + 6;
    if (uVar15 < 10) {
      uVar9 = (int)uVar15 + 0x26;
    }
    else {
      uVar9 = (uint)uVar19;
      if (uVar15 < 0x86) {
        uVar3 = 0x1f;
        if (uVar9 != 0) {
          for (; uVar9 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        bVar8 = (char)(uVar3 ^ 0xffffffe0) + 0x1f;
        iVar6 = (int)(uVar19 >> (bVar8 & 0x3f));
        uVar9 = (uVar9 - (iVar6 << (bVar8 & 0x1f))) * 0x100 |
                iVar6 + (uVar3 ^ 0xffffffe0) * 2 + 0x6a;
      }
      else if (uVar15 < 0x846) {
        iVar6 = 0x1f;
        if (uVar9 - 0x40 != 0) {
          for (; uVar9 - 0x40 >> iVar6 == 0; iVar6 = iVar6 + -1) {
          }
        }
        uVar9 = ((int)(-1L << ((byte)iVar6 & 0x3f)) + uVar9 + -0x40) * 0x100 + iVar6 + 0x34;
      }
      else {
        uVar9 = (int)uVar15 * 0x100 - 0x845c1;
      }
    }
    uVar4 = (int)uVar12 + 3;
    uVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    bVar8 = 0x1e - (char)(uVar3 ^ 0x1f);
    bVar25 = (uVar4 >> (bVar8 & 0x1f) & 1) != 0;
    __src = (long *)((long)__src + uVar19 + 6);
    *local_80 = uVar9;
    local_80[1] = (uint)bVar25 +
                  ((uVar4 - (bVar25 + 2 << (bVar8 & 0x1f))) * 0x100 | (uVar3 ^ 0x1f) * 2 ^ 0x3e) +
                  0x4c;
    local_80 = local_80 + 2;
    uVar15 = uVar12 & 0xffffffff;
  }
  goto LAB_0013471f;
code_r0x00134811:
  lVar14 = lVar14 + -8;
  uVar19 = uVar19 + 1;
  goto LAB_001347ec;
code_r0x00134b08:
  lVar14 = lVar14 + -8;
  uVar19 = uVar19 + 1;
  goto LAB_00134af2;
}

Assistant:

void BrotliCompressFragmentTwoPass(
    MemoryManager* m, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, uint32_t* command_buf, uint8_t* literal_buf,
    int* table, size_t table_size, size_t* storage_ix, uint8_t* storage) {
  const size_t initial_storage_ix = *storage_ix;
  const size_t table_bits = Log2FloorNonZero(table_size);
  switch (table_bits) {
#define CASE_(B)                                      \
    case B:                                           \
      BrotliCompressFragmentTwoPassImpl ## B(         \
          m, input, input_size, is_last, command_buf, \
          literal_buf, table, storage_ix, storage);   \
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: BROTLI_DCHECK(0); break;
  }

  /* If output is larger than single uncompressed block, rewrite it. */
  if (*storage_ix - initial_storage_ix > 31 + (input_size << 3)) {
    RewindBitPosition(initial_storage_ix, storage_ix, storage);
    EmitUncompressedMetaBlock(input, input_size, storage_ix, storage);
  }

  if (is_last) {
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
  }
}